

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadMessageNoVirtual<google::protobuf::EnumValueOptions>
               (CodedInputStream *input,EnumValueOptions *value)

{
  bool bVar1;
  Limit limit_00;
  uint32 local_24;
  Limit limit;
  uint32 length;
  EnumValueOptions *value_local;
  CodedInputStream *input_local;
  
  _limit = value;
  value_local = (EnumValueOptions *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if (bVar1) {
    bVar1 = io::CodedInputStream::IncrementRecursionDepth((CodedInputStream *)value_local);
    if (bVar1) {
      limit_00 = io::CodedInputStream::PushLimit((CodedInputStream *)value_local,local_24);
      bVar1 = EnumValueOptions::MergePartialFromCodedStream(_limit,(CodedInputStream *)value_local);
      if (bVar1) {
        bVar1 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)value_local);
        if (bVar1) {
          io::CodedInputStream::PopLimit((CodedInputStream *)value_local,limit_00);
          io::CodedInputStream::DecrementRecursionDepth((CodedInputStream *)value_local);
          input_local._7_1_ = true;
        }
        else {
          input_local._7_1_ = false;
        }
      }
      else {
        input_local._7_1_ = false;
      }
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

inline bool WireFormatLite::ReadMessageNoVirtual(
    io::CodedInputStream* input, MessageType_WorkAroundCppLookupDefect* value) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->IncrementRecursionDepth()) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  if (!value->
      MessageType_WorkAroundCppLookupDefect::MergePartialFromCodedStream(input))
    return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  if (!input->ConsumedEntireMessage()) return false;
  input->PopLimit(limit);
  input->DecrementRecursionDepth();
  return true;
}